

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke.cc
# Opt level: O1

int p256_generate_key(EVP_HPKE_KEY *key)

{
  int iVar1;
  uint8_t seed [32];
  uchar auStack_38 [32];
  
  RAND_bytes(auStack_38,0x20);
  iVar1 = p256_private_key_from_seed(key->private_key,auStack_38);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = p256_public_from_private(key->public_key,key->private_key);
  }
  return iVar1;
}

Assistant:

static int p256_generate_key(EVP_HPKE_KEY *key) {
  uint8_t seed[P256_SEED_LEN];
  RAND_bytes(seed, sizeof(seed));
  if (!p256_private_key_from_seed(key->private_key, seed) ||
      !p256_public_from_private(key->public_key, key->private_key)) {
    return 0;
  }
  return 1;
}